

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Macintosh.cpp
# Opt level: O1

bool __thiscall
Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)0>::insert_media
          (ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)0> *this,Media *media)

{
  pointer psVar1;
  pointer psVar2;
  pointer psVar3;
  element_type *peVar4;
  bool bVar5;
  undefined8 *puVar6;
  Drive *this_00;
  
  psVar1 = (media->disks).
           super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (media->disks).
           super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar1 == psVar2) {
    if ((media->mass_storage_devices).
        super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (media->mass_storage_devices).
        super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      return false;
    }
    if (psVar1 == psVar2) goto LAB_002a2e29;
  }
  bVar5 = Storage::Disk::Drive::has_disk((Drive *)&this->field_0xe28);
  this_00 = (Drive *)&this->field_0xfa0;
  if (!bVar5) {
    this_00 = (Drive *)&this->field_0xe28;
  }
  Storage::Disk::Drive::set_disk
            (this_00,(media->disks).
                     super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
LAB_002a2e29:
  psVar3 = (media->mass_storage_devices).
           super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (psVar3 != (media->mass_storage_devices).
                super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    peVar4 = (psVar3->
             super___shared_ptr<Storage::MassStorage::MassStorageDevice,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    if (peVar4 == (element_type *)0x0) {
      puVar6 = (undefined8 *)0x0;
    }
    else {
      puVar6 = (undefined8 *)
               __dynamic_cast(peVar4,&Storage::MassStorage::MassStorageDevice::typeinfo,
                              &Storage::MassStorage::Encodings::Macintosh::Volume::typeinfo,
                              0xfffffffffffffffe);
    }
    if (puVar6 != (undefined8 *)0x0) {
      (**(code **)*puVar6)(puVar6,0);
    }
    SCSI::DirectAccessDevice::set_storage
              (&(this->hard_drive_).executor_,
               (media->mass_storage_devices).
               super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  return true;
}

Assistant:

bool insert_media(const Analyser::Static::Media &media) final {
			if(media.disks.empty() && media.mass_storage_devices.empty())
				return false;

			// TODO: shouldn't allow disks to be replaced like this, as the Mac
			// uses software eject. Will need to expand messaging ability of
			// insert_media.
			if(!media.disks.empty()) {
				if(drives_[0].has_disk())
					drives_[1].set_disk(media.disks[0]);
				else
					drives_[0].set_disk(media.disks[0]);
			}

			// TODO: allow this only at machine startup?
			if(!media.mass_storage_devices.empty()) {
				const auto volume = dynamic_cast<Storage::MassStorage::Encodings::Macintosh::Volume *>(media.mass_storage_devices.front().get());
				if(volume) {
					volume->set_drive_type(Storage::MassStorage::Encodings::Macintosh::DriveType::SCSI);
				}
				hard_drive_->set_storage(media.mass_storage_devices.front());
			}

			return true;
		}